

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 14.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  char w;
  char eme [8];
  char local_19;
  char local_18 [8];
  
  builtin_strncpy(local_18,"\x1b[1;37m",8);
  sVar1 = strlen(local_18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_18,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Voce acredita que o humano nasce da alteridade(s/n)?",0x34);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,&local_19);
  if (local_19 == 'n') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Voce precisa estudar o grande filosofo judeu lituano\n",0x35);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Emanuel Levinas!",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
  }
  else {
    if (local_19 == 's') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_8fb,0x3b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"o comeco do filosofar, o fundamento da razao, o sentido\n",
                 0x38);
      pcVar3 = anon_var_dwarf_927;
      lVar2 = 0x40;
    }
    else {
      pcVar3 = "Opcao invalida.Tente outra vez\n";
      lVar2 = 0x1f;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    char eme[] = {0x1b, '[', '1', ';', '3', '7', 'm', 0};
    cout << eme;
    const char s = 's';
    const char n = 'n';
    char w;

    cout << "Voce acredita que o humano nasce da alteridade(s/n)?" << endl;
    cin >> w;

    if (w == s)
    {
        cout << "SIM!Para o grande filósofo Emanuel Levinas, a ALTERIDADE,\n";
        cout << "o comeco do filosofar, o fundamento da razao, o sentido\n";
        cout << "do humano eh a possibilidade de realização da justica e paz!!\n";
    }
    else if (w == n)
    {
        cout << "Voce precisa estudar o grande filosofo judeu lituano\n";
        cout << "Emanuel Levinas!" << endl;
    }
    else
    {
        cout << "Opcao invalida.Tente outra vez\n";
    }

    return 0;
}